

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

boolean create_critters(int cnt,permonst *mptr)

{
  boolean bVar1;
  monst *worm;
  obj *poVar2;
  int iVar3;
  char local_32;
  boolean local_31;
  boolean ask;
  boolean known;
  monst *mon;
  int local_20;
  int y;
  int x;
  coord c;
  permonst *mptr_local;
  int cnt_local;
  
  local_31 = '\0';
  local_32 = flags.debug;
  _x = mptr;
  mptr_local._4_4_ = cnt;
LAB_0020b780:
  do {
    while( true ) {
      iVar3 = mptr_local._4_4_ + -1;
      if (mptr_local._4_4_ == 0) {
        return local_31;
      }
      mptr_local._4_4_ = iVar3;
      if (local_32 == '\0') break;
      bVar1 = create_particular();
      if (bVar1 == '\0') {
        local_32 = '\0';
        break;
      }
      local_31 = '\x01';
    }
    local_20 = (int)u.ux;
    mon._4_4_ = (int)u.uy;
    if (((_x == (permonst *)0x0) && (((byte)u._1052_1_ >> 1 & 1) != 0)) &&
       (bVar1 = enexto((coord *)((long)&y + 2),level,u.ux,u.uy,mons + 0x14c), bVar1 != '\0')) {
      local_20 = (int)y._2_1_;
      mon._4_4_ = (int)y._3_1_;
    }
    worm = makemon(_x,level,local_20,mon._4_4_,0);
  } while (worm == (monst *)0x0);
  if (worm->wormno == '\0') {
    if (((viz_array[worm->my][worm->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((worm->data->mflags3 & 0x200) != 0 && ((viz_array[worm->my][worm->mx] & 1U) != 0))))))))
    goto LAB_0020b9b6;
LAB_0020ba43:
    if (((((worm->data->mflags1 & 0x10000) != 0) ||
         ((poVar2 = which_armor(worm,4), poVar2 != (obj *)0x0 &&
          (poVar2 = which_armor(worm,4), poVar2->otyp == 0x4f)))) ||
        (((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar3 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar1 = match_warn_of_mon(worm), bVar1 == '\0')))) goto LAB_0020b780;
  }
  else {
    bVar1 = worm_known(level,worm);
    if (bVar1 == '\0') goto LAB_0020ba43;
LAB_0020b9b6:
    if (((((((*(uint *)&worm->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&worm->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&worm->field_0x60 >> 9 & 1) != 0)
         ))) || (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_0020ba43;
  }
  local_31 = '\x01';
  goto LAB_0020b780;
}

Assistant:

boolean create_critters(int cnt,
			const struct permonst *mptr) /* usually null; used for confused reading */
{
	coord c;
	int x, y;
	struct monst *mon;
	boolean known = FALSE;
	boolean ask = wizard;

	while (cnt--) {
	    if (ask) {
		if (create_particular()) {
		    known = TRUE;
		    continue;
		}
		else ask = FALSE;	/* ESC will shut off prompting */
	    }
	    x = u.ux,  y = u.uy;
	    /* if in water, try to encourage an aquatic monster
	       by finding and then specifying another wet location */
	    if (!mptr && u.uinwater && enexto(&c, level, x, y, &mons[PM_GIANT_EEL]))
		x = c.x,  y = c.y;

	    mon = makemon(mptr, level, x, y, NO_MM_FLAGS);
	    if (mon && canspotmon(level, mon)) known = TRUE;
	}
	return known;
}